

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsvctrl.c
# Opt level: O2

int main(int argc,char **argv)

{
  int __fd;
  int iVar1;
  byte *pbVar2;
  uint uVar3;
  int p1;
  char **ppcVar4;
  byte bVar5;
  void *p2;
  
  progname = *argv;
  pbVar2 = (byte *)argv[1];
  if (pbVar2 == (byte *)0x0) {
    usage();
    pbVar2 = (byte *)argv[1];
  }
  bVar5 = *pbVar2;
  uVar3 = bVar5 - 0x61;
  p2 = (void *)(ulong)uVar3;
  if (uVar3 < 0x18) {
    if ((0x99c58dU >> (uVar3 & 0x1f) & 1) != 0) goto LAB_0010231e;
    if (uVar3 == 4) {
      bVar5 = 0x78;
      goto LAB_0010231e;
    }
  }
  if (1 < bVar5 - 0x31) {
    usage();
  }
LAB_0010231e:
  if (argv[2] == (char *)0x0) {
    usage();
  }
  __fd = open_read(".");
  if (__fd == -1) {
    rc = 100;
    fatal("unable to open current directory");
  }
  for (ppcVar4 = argv + 2; *ppcVar4 != (char *)0x0; ppcVar4 = ppcVar4 + 1) {
    iVar1 = chdir(*ppcVar4);
    if (iVar1 == -1) {
      warn(*ppcVar4,"unable to change directory");
    }
    else {
      ctrl((EVP_PKEY_CTX *)*ppcVar4,(int)(char)bVar5,p1,p2);
      iVar1 = fchdir(__fd);
      if (iVar1 == -1) {
        rc = 100;
        fatal("unable to change directory");
      }
    }
  }
  if (100 < rc) {
    rc = 100;
  }
  _exit(rc);
}

Assistant:

int main(int argc, char **argv) {
  char **dir;
  int curdir;
  char c;

  progname =*argv++;

  if (! argv || ! *argv) usage();

  switch ((c =**argv)) {
  case 'e': c ='x';
  case 'u': case 'd': case 'o': case 'x': case 'p': case 'c': case 'h':
  case 'a': case 'i': case 't': case 'k': case 'q': case '1': case '2':
    break;
  default:
    usage();
  }
  dir =++argv;
  if (! dir || ! *dir) usage();

  if ((curdir =open_read(".")) == -1) {
    rc =100;
    fatal("unable to open current directory");
  }
  for (; dir && *dir; dir++) {
    if (chdir(*dir) == -1) {
      warn(*dir, "unable to change directory");
      continue;
    }
    ctrl(*dir, c);
    if (fchdir(curdir) == -1) {
      rc =100;
      fatal("unable to change directory");
    }
  }
  if (rc > 100) rc =100;
  _exit(rc);
}